

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

Names * __thiscall
cmGeneratorTarget::GetLibraryNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  string *psVar1;
  string *vName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  char *version;
  long *plVar7;
  size_type *psVar8;
  char *version_00;
  string msg;
  string prefix;
  string suffix;
  string local_e0;
  string local_c0;
  cmMakefile *local_a0;
  string local_98;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->Base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Base).field_2
  ;
  (__return_storage_ptr__->Base)._M_string_length = 0;
  (__return_storage_ptr__->Base).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Output).field_2;
  (__return_storage_ptr__->Output)._M_string_length = 0;
  (__return_storage_ptr__->Output).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->Real)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Real).field_2
  ;
  (__return_storage_ptr__->Real)._M_string_length = 0;
  (__return_storage_ptr__->Real).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ImportLibrary)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ImportLibrary).field_2;
  (__return_storage_ptr__->ImportLibrary)._M_string_length = 0;
  (__return_storage_ptr__->ImportLibrary).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->PDB)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->PDB).field_2;
  (__return_storage_ptr__->PDB)._M_string_length = 0;
  (__return_storage_ptr__->PDB).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->SharedObject)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->SharedObject).field_2;
  (__return_storage_ptr__->SharedObject)._M_string_length = 0;
  (__return_storage_ptr__->SharedObject).field_2._M_local_buf[0] = '\0';
  paVar2 = &local_e0.field_2;
  if (this->Target->IsImportedTarget == true) {
    local_98._M_dataplus._M_p = (pointer)0x2b;
    local_e0._M_dataplus._M_p = (pointer)paVar2;
    local_e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_98);
    local_e0.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
    builtin_strncpy(local_e0._M_dataplus._M_p,"GetLibraryNames called on imported target: ",0x2b);
    local_e0._M_string_length = (size_type)local_98._M_dataplus._M_p;
    local_e0._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_e0,(ulong)(this->Target->Name)._M_dataplus._M_p);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0._M_string_length = 7;
  local_e0.field_2._M_allocated_capacity = 0x4e4f4953524556;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  pcVar6 = GetProperty(this,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_e0.field_2._8_2_ = 0x4e;
  local_e0._M_string_length = 9;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  version = GetProperty(this,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_78 = config;
  bVar3 = HasSOName(this,config);
  bVar5 = true;
  if (bVar3) {
    local_a0 = this->Makefile;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_98._M_dataplus._M_p = (pointer)0x22;
    local_e0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_98);
    local_e0.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x10) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x11) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x12) = 'V';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x13) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x14) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x15) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x16) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x17) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x18) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x19) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x1a) = 'D';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x1b) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x1c) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x1d) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x1e) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x1f) = 'A';
    *(undefined8 *)local_e0._M_dataplus._M_p = 0x4c505f454b414d43;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 8) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 9) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 10) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0xb) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0xc) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0xd) = 'M';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0xe) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0xf) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x20) = 'M';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p + 0x21) = 'E';
    local_e0._M_string_length = (size_type)local_98._M_dataplus._M_p;
    local_e0._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
    bVar4 = cmMakefile::IsOn(local_a0,&local_e0);
    if (!bVar4) {
      bVar5 = IsFrameworkOnApple(this);
    }
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5 != false) {
    version = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  version_00 = pcVar6;
  if (version != (char *)0x0) {
    version_00 = version;
  }
  if (pcVar6 == (char *)0x0) {
    version_00 = version;
  }
  if (version_00 == (char *)0x0) {
    version = pcVar6;
  }
  if (pcVar6 != (char *)0x0) {
    version = pcVar6;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,local_78,RuntimeBinaryArtifact,&local_98,&__return_storage_ptr__->Base,
                      &local_70);
  std::operator+(&local_50,&local_98,&__return_storage_ptr__->Base);
  local_a0 = (cmMakefile *)this;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  psVar1 = &__return_storage_ptr__->Output;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar7[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)psVar1,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar3 = IsFrameworkOnApple((cmGeneratorTarget *)this_00);
  vName = &__return_storage_ptr__->Real;
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)vName);
    bVar3 = cmMakefile::PlatformIsAppleEmbedded(*(cmMakefile **)((long)this_00 + 8));
    if (!bVar3) {
      std::__cxx11::string::append((char *)vName);
      GetFrameworkVersion_abi_cxx11_(&local_c0,(cmGeneratorTarget *)this_00);
      std::__cxx11::string::_M_append((char *)vName,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)vName);
    }
    std::__cxx11::string::_M_append
              ((char *)vName,(ulong)(__return_storage_ptr__->Base)._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->SharedObject);
  }
  else {
    ComputeVersionedName
              ((cmGeneratorTarget *)this_00,&__return_storage_ptr__->SharedObject,&local_98,
               &__return_storage_ptr__->Base,&local_70,psVar1,version_00);
    ComputeVersionedName
              ((cmGeneratorTarget *)this_00,vName,&local_98,&__return_storage_ptr__->Base,&local_70,
               psVar1,version);
  }
  psVar1 = local_78;
  if (((*(cmTarget **)&this_00->FindPackageRootPathStack)->TargetTypeValue & ~STATIC_LIBRARY) ==
      SHARED_LIBRARY) {
    GetFullNameInternal(&local_c0,(cmGeneratorTarget *)this_00,local_78,ImportLibraryArtifact);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  GetPDBName(&local_c0,(cmGeneratorTarget *)this_00,psVar1);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetLibraryNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if (!this->HasSOName(config) ||
      this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
      this->IsFrameworkOnApple()) {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = nullptr;
    soversion = nullptr;
  }
  if (version && !soversion) {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
  }
  if (!version && soversion) {
    // Use the soversion as the library version.
    version = soversion;
  }

  // Get the components of the library name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The library name.
  targetNames.Output = prefix + targetNames.Base + suffix;

  if (this->IsFrameworkOnApple()) {
    targetNames.Real = prefix;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      targetNames.Real += "Versions/";
      targetNames.Real += this->GetFrameworkVersion();
      targetNames.Real += "/";
    }
    targetNames.Real += targetNames.Base;
    targetNames.SharedObject = targetNames.Real;
  } else {
    // The library's soname.
    this->ComputeVersionedName(targetNames.SharedObject, prefix,
                               targetNames.Base, suffix, targetNames.Output,
                               soversion);

    // The library's real name on disk.
    this->ComputeVersionedName(targetNames.Real, prefix, targetNames.Base,
                               suffix, targetNames.Output, version);
  }

  // The import library name.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames.ImportLibrary =
      this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  }

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}